

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.cpp
# Opt level: O2

ConstantValue * __thiscall slang::CVConstIterator::operator*(CVConstIterator *this)

{
  __index_type _Var1;
  ConstantValue *pCVar2;
  anon_class_1_0_00000001 local_9;
  
  _Var1 = *(__index_type *)
           ((long)&(this->current).
                   super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   .
                   super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   .
                   super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   .
                   super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   .
                   super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                   .
                   super__Variant_storage_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
           + 0x20);
  if (_Var1 == 0xff) {
    std::__throw_bad_variant_access("std::visit: variant is valueless");
    _Var1 = *(__index_type *)
             ((long)&(this->current).
                     super__Variant_base<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                     .
                     super__Move_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                     .
                     super__Copy_assign_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                     .
                     super__Move_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                     .
                     super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
                     .
                     super__Variant_storage_alias<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>
             + 0x20);
  }
  pCVar2 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<const_slang::ConstantValue_&>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/ConstantValue.cpp:654:9)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<const_slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_const_slang::ConstantValue_&,_const_slang::ConstantValue_*>_>_&>
             ::_S_vtable._M_arr[(char)_Var1]._M_data)(&local_9,&this->current);
  return pCVar2;
}

Assistant:

const ConstantValue& CVConstIterator::operator*() const {
    return std::visit(
        [](auto&& arg) -> const ConstantValue& {
            using T = std::decay_t<decltype(arg)>;
            if constexpr (std::is_same_v<T, AssociativeArray::const_iterator>)
                return arg->second;
            else
                return *arg;
        },
        current);
}